

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtstart.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  FILE *__stream;
  char **in_RSI;
  int in_EDI;
  int character;
  int y;
  uint32_t word;
  int32_t i;
  FILE *payload;
  uint32_t base;
  int cnum;
  int c;
  uint local_38;
  int local_34;
  uint local_30;
  int local_2c;
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_18 = 0;
    local_1c = 0;
    while (local_14 = getopt(local_8,local_10,"c:bv"), local_14 != -1) {
      if (local_14 == 0x62) {
        local_1c = 0x103000;
      }
      else if (local_14 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_18);
      }
      else if (local_14 == 0x76) {
        local_1c = 0xf000;
      }
    }
    if (local_18 < nva_cardsnum) {
      if (local_1c == 0) {
        fprintf(_stderr,"No engine specified. Specify -b for PBSP, -v for PVP\n");
        local_4 = 1;
      }
      else if (_optind < local_8) {
        __stream = fopen(local_10[_optind],"rb");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,"Binary file %s could not be opened.\n",local_10[_optind]);
          local_4 = 1;
        }
        else {
          fprintf(_stderr,"Uploading file %s.\n",local_10[_optind]);
          nva_wr32(local_18,0x200,0x40110011);
          nva_wr32(local_18,0x200,0xffffffff);
          usleep(1000);
          nva_wr32(local_18,0x1700,0x10);
          if (local_1c == 0x103000) {
            nva_wr32(local_18,0x701080,0x190000);
            nva_wr32(local_18,0x701084,0x3fffff);
            nva_wr32(local_18,0x701088,0x300000);
            nva_wr32(local_18,0x70108c,0);
            nva_wr32(local_18,0x701090,0);
            nva_wr32(local_18,0x701094,0);
          }
          else {
            nva_wr32(local_18,0x701040,0x190000);
            nva_wr32(local_18,0x701044,0x3fffff);
            nva_wr32(local_18,0x701048,0x300000);
            nva_wr32(local_18,0x70104c,0);
            nva_wr32(local_18,0x701050,0);
            nva_wr32(local_18,0x701054,0);
          }
          nva_wr32(local_18,0x1700,0x30);
          nva_wr32(local_18,0x700000,0);
          nva_wr32(local_18,0x1700,0x20);
          for (local_2c = 0; local_2c < 0x100000; local_2c = local_2c + 4) {
            nva_wr32(local_18,local_2c + 0x700000,0xffff06);
          }
          local_2c = 0;
          while( true ) {
            local_30 = 0;
            local_38 = 0;
            local_34 = 0;
            while ((local_34 < 4 && (local_38 = fgetc(__stream), local_38 != 0xffffffff))) {
              local_30 = (local_38 & 0xff) << ((byte)(local_34 << 3) & 0x1f) | local_30;
              local_34 = local_34 + 1;
            }
            nva_wr32(local_18,local_2c + 0x700000,local_30);
            if (local_38 == 0xffffffff) break;
            local_2c = local_2c + 4;
          }
          nva_wr32(local_18,0x70000,1);
          do {
            uVar2 = nva_rd32(local_18,0x70000);
          } while (uVar2 != 0);
          usleep(1000);
          nva_wr32(local_18,local_1c + 0xd10,0x1fffffff);
          nva_wr32(local_18,local_1c + 0xd08,0xfffffff);
          nva_wr32(local_18,local_1c + 0xd28,0x90044);
          nva_wr32(local_18,local_1c + 0xcc0,0x2000);
          nva_wr32(local_18,local_1c + 0xcc4,0x1c);
          nva_wr32(local_18,local_1c + 0xcc8,0x400);
          nva_wr32(local_18,local_1c + 0xce4,0);
          nva_wr32(local_18,local_1c + 0xce8,0xf);
          nva_wr32(local_18,local_1c + 0xcec,0x404);
          nva_wr32(local_18,local_1c + 0xc20,0x3f);
          nva_wr32(local_18,local_1c + 0xd84,0x3f);
          iVar1 = local_18;
          uVar2 = nva_rd32(local_18,0x1588);
          nva_wr32(iVar1,0x1588,uVar2 & 0xffff0000);
          nva_wr32(local_18,0x2500,1);
          nva_wr32(local_18,0x3200,1);
          nva_wr32(local_18,0x3250,1);
          nva_wr32(local_18,0x1700,0x10);
          nva_wr32(local_18,0x700f00,0);
          nva_wr32(local_18,0x700f04,0);
          nva_wr32(local_18,0x700f08,0);
          nva_wr32(local_18,0x700f0c,0);
          nva_wr32(local_18,0x700f10,0);
          nva_wr32(local_18,0x700f14,0);
          nva_wr32(local_18,0x700f18,0);
          nva_wr32(local_18,0x700f1c,0);
          nva_wr32(local_18,0x700f20,0);
          nva_wr32(local_18,0x700f24,0);
          nva_wr32(local_18,0x700f28,0);
          nva_wr32(local_18,0x700f2c,0);
          nva_wr32(local_18,0x700f30,0);
          nva_wr32(local_18,0x700f34,0);
          nva_wr32(local_18,0x700f38,0);
          nva_wr32(local_18,0x700f3c,0x403f6078);
          nva_wr32(local_18,0x700f40,0);
          nva_wr32(local_18,0x700f44,0x2101ffff);
          nva_wr32(local_18,0x700f48,0x10);
          nva_wr32(local_18,0x700f4c,0);
          nva_wr32(local_18,0x700f50,0x110000);
          nva_wr32(local_18,0x700f54,0x80000);
          nva_wr32(local_18,0x700f58,0);
          nva_wr32(local_18,0x700f5c,0);
          nva_wr32(local_18,0x700f60,0);
          nva_wr32(local_18,0x700f64,0);
          nva_wr32(local_18,0x700f68,0);
          nva_wr32(local_18,0x700f6c,0);
          nva_wr32(local_18,0x700f70,0);
          nva_wr32(local_18,0x700f74,0);
          nva_wr32(local_18,0x700f78,0);
          nva_wr32(local_18,0x700f7c,0x30000fff);
          nva_wr32(local_18,0x700f80,0x4000600);
          nva_wr32(local_18,0x700f84,0);
          nva_wr32(local_18,0x700f88,0x410);
          nva_wr32(local_18,0x700f8c,0);
          nva_wr32(local_18,0x700f90,0);
          nva_wr32(local_18,0x700f94,0);
          nva_wr32(local_18,0x700f98,0x101);
          nva_wr32(local_18,0x700e00,0);
          nva_wr32(local_18,0x700e04,0);
          nva_wr32(local_18,0x700e08,0);
          nva_wr32(local_18,0x700e0c,0);
          nva_wr32(local_18,0x700e10,0);
          nva_wr32(local_18,0x700e14,0);
          nva_wr32(local_18,0x700e18,0);
          nva_wr32(local_18,0x700e1c,0);
          nva_wr32(local_18,0x700e20,0);
          nva_wr32(local_18,0x700e24,0);
          nva_wr32(local_18,0x700e28,0);
          nva_wr32(local_18,0x700e2c,0);
          nva_wr32(local_18,0x700e30,0);
          nva_wr32(local_18,0x700e34,0);
          nva_wr32(local_18,0x700e38,0);
          nva_wr32(local_18,0x700e3c,0x403f6078);
          nva_wr32(local_18,0x700e40,0);
          nva_wr32(local_18,0x700e44,0x2101ffff);
          nva_wr32(local_18,0x700e48,0x10);
          nva_wr32(local_18,0x700e4c,0);
          nva_wr32(local_18,0x700e50,0x110000);
          nva_wr32(local_18,0x700e54,0x80000);
          nva_wr32(local_18,0x700e58,0);
          nva_wr32(local_18,0x700e5c,0);
          nva_wr32(local_18,0x700e60,0);
          nva_wr32(local_18,0x700e64,0);
          nva_wr32(local_18,0x700e68,0);
          nva_wr32(local_18,0x700e6c,0);
          nva_wr32(local_18,0x700e70,0);
          nva_wr32(local_18,0x700e74,0);
          nva_wr32(local_18,0x700e78,0);
          nva_wr32(local_18,0x700e7c,0x30000fff);
          nva_wr32(local_18,0x700e80,0x4000600);
          nva_wr32(local_18,0x700e84,0);
          nva_wr32(local_18,0x700e88,0x410);
          nva_wr32(local_18,0x700e8c,0);
          nva_wr32(local_18,0x700e90,0);
          nva_wr32(local_18,0x700e94,0);
          nva_wr32(local_18,0x700e98,0x101);
          for (local_2c = 0; local_2c < 0x1001; local_2c = local_2c + 4) {
            nva_wr32(local_18,local_2c + 0x706000,0);
          }
          nva_wr32(local_18,0x707008,1);
          if (local_1c == 0x103000) {
            nva_wr32(local_18,0x70700c,0x600004);
          }
          else {
            nva_wr32(local_18,0x70700c,0x400004);
          }
          nva_wr32(local_18,0x701100,0x19003d);
          nva_wr32(local_18,0x701104,0xffffffff);
          nva_wr32(local_18,0x701108,0);
          nva_wr32(local_18,0x70110c,0);
          nva_wr32(local_18,0x701110,0);
          nva_wr32(local_18,0x701114,0);
          nva_wr32(local_18,0x709000,1);
          nva_wr32(local_18,0x70000,1);
          do {
            uVar2 = nva_rd32(local_18,0x70000);
          } while (uVar2 != 0);
          nva_wr32(local_18,0x2600,0x8000100d);
          nva_wr32(local_18,0x2604,0xc000100f);
          nva_wr32(local_18,0x27fc,0x8000100e);
          nva_wr32(local_18,0x32f4,0x109);
          nva_wr32(local_18,0x32ec,1);
          nva_wr32(local_18,0x2500,0x101);
          nva_wr32(local_18,0x720000,0x40000);
          nva_wr32(local_18,0x720004,1);
          nva_wr32(local_18,0x710000,0x120000);
          nva_wr32(local_18,0x710004,0x8000);
          nva_wr32(local_18,0x70000,1);
          do {
            uVar2 = nva_rd32(local_18,0x70000);
          } while (uVar2 != 0);
          nva_wr32(local_18,0xc0208c,1);
          local_4 = 0;
        }
      }
      else {
        fprintf(_stderr,"At least specify payload file.\n");
        local_4 = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	uint32_t base = 0;
	while ((c = getopt (argc, argv, "c:bv")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
				base = 0x103000;
				break;
			case 'v':
				base = 0xf000;
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PBSP, -v for PVP\n");
		return 1;
	}
	
	if (optind >= argc) {
	    fprintf(stderr, "At least specify payload file.\n");
	    return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");
    
    if (payload == NULL) {
        fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
        return 1;
    } else {
        fprintf(stderr, "Uploading file %s.\n", argv[optind]);
    }
    
    int32_t i;
	nva_wr32(cnum, 0x200, 0x40110011);
	nva_wr32(cnum, 0x200, 0xffffffff);
	usleep(1000);
	nva_wr32(cnum, 0x1700, 0x10);
	if (base == 0x103000) {
		nva_wr32(cnum, 0x701080, 0x00190000);
		nva_wr32(cnum, 0x701084, 0x003fffff);
		nva_wr32(cnum, 0x701088, 0x00300000);
		nva_wr32(cnum, 0x70108c, 0x00000000);
		nva_wr32(cnum, 0x701090, 0x00000000);
		nva_wr32(cnum, 0x701094, 0x00000000);
	} else {
		nva_wr32(cnum, 0x701040, 0x00190000);
		nva_wr32(cnum, 0x701044, 0x003fffff);
		nva_wr32(cnum, 0x701048, 0x00300000);
		nva_wr32(cnum, 0x70104c, 0x00000000);
		nva_wr32(cnum, 0x701050, 0x00000000);
		nva_wr32(cnum, 0x701054, 0x00000000);
	}
	nva_wr32(cnum, 0x1700, 0x30);
	nva_wr32(cnum, 0x700000, 0x00000000);
	nva_wr32(cnum, 0x1700, 0x20);
	for (i = 0; i < 0x100000; i+= 4)
		nva_wr32(cnum, 0x700000 + i, 0xffff06);
		
	for (i = 0; ; i += 4) {
	    uint32_t word = 0;
	    int y;
	    int character = 0;
	    for (y = 0; y < 4; y++) {
    		character = fgetc(payload);
    		if (character == EOF) {
    		    break;
    		}
    		word |= ((unsigned char)character) << (y * 8);
    	}
    	nva_wr32(cnum, 0x700000 + i, word);
   		if (character == EOF) {
   		    break;
   		}
	}
	
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	usleep(1000);
	nva_wr32(cnum, base+0xd10, 0x1fffffff);
	nva_wr32(cnum, base+0xd08, 0xfffffff);
	nva_wr32(cnum, base+0xd28, 0x90044);
	nva_wr32(cnum, base+0xcc0, 0x2000);
	nva_wr32(cnum, base+0xcc4, 0x1c);
	nva_wr32(cnum, base+0xcc8, 0x400);
	nva_wr32(cnum, base+0xce4, 0x0000);
	nva_wr32(cnum, base+0xce8, 0x0f);
	nva_wr32(cnum, base+0xcec, 0x404);
	nva_wr32(cnum, base+0xc20, 0x3f);
	nva_wr32(cnum, base+0xd84, 0x3f);
	nva_wr32(cnum, 0x1588, nva_rd32(cnum, 0x1588) & ~0xffff);
	nva_wr32(cnum, 0x2500, 1);
	nva_wr32(cnum, 0x3200, 1);
	nva_wr32(cnum, 0x3250, 1);
	nva_wr32(cnum, 0x1700, 0x10);
	nva_wr32(cnum, 0x700000+0xf00, 0);
	nva_wr32(cnum, 0x700000+0xf04, 0);
	nva_wr32(cnum, 0x700000+0xf08, 0);
	nva_wr32(cnum, 0x700000+0xf0c, 0);
	nva_wr32(cnum, 0x700000+0xf10, 0);
	nva_wr32(cnum, 0x700000+0xf14, 0);
	nva_wr32(cnum, 0x700000+0xf18, 0);
	nva_wr32(cnum, 0x700000+0xf1c, 0);
	nva_wr32(cnum, 0x700000+0xf20, 0);
	nva_wr32(cnum, 0x700000+0xf24, 0);
	nva_wr32(cnum, 0x700000+0xf28, 0);
	nva_wr32(cnum, 0x700000+0xf2c, 0);
	nva_wr32(cnum, 0x700000+0xf30, 0);
	nva_wr32(cnum, 0x700000+0xf34, 0);
	nva_wr32(cnum, 0x700000+0xf38, 0);
	nva_wr32(cnum, 0x700000+0xf3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xf40, 0);
	nva_wr32(cnum, 0x700000+0xf44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xf48, 0x10);
	nva_wr32(cnum, 0x700000+0xf4c, 0);
	nva_wr32(cnum, 0x700000+0xf50, 0x110000);
	nva_wr32(cnum, 0x700000+0xf54, 0x80000);
	nva_wr32(cnum, 0x700000+0xf58, 0);
	nva_wr32(cnum, 0x700000+0xf5c, 0);
	nva_wr32(cnum, 0x700000+0xf60, 0);
	nva_wr32(cnum, 0x700000+0xf64, 0);
	nva_wr32(cnum, 0x700000+0xf68, 0);
	nva_wr32(cnum, 0x700000+0xf6c, 0);
	nva_wr32(cnum, 0x700000+0xf70, 0);
	nva_wr32(cnum, 0x700000+0xf74, 0);
	nva_wr32(cnum, 0x700000+0xf78, 0);
	nva_wr32(cnum, 0x700000+0xf7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xf80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xf84, 0);
	nva_wr32(cnum, 0x700000+0xf88, 0x410);
	nva_wr32(cnum, 0x700000+0xf8c, 0);
	nva_wr32(cnum, 0x700000+0xf90, 0);
	nva_wr32(cnum, 0x700000+0xf94, 0);
	nva_wr32(cnum, 0x700000+0xf98, 0x101);

	nva_wr32(cnum, 0x700000+0xe00, 0);
	nva_wr32(cnum, 0x700000+0xe04, 0);
	nva_wr32(cnum, 0x700000+0xe08, 0);
	nva_wr32(cnum, 0x700000+0xe0c, 0);
	nva_wr32(cnum, 0x700000+0xe10, 0);
	nva_wr32(cnum, 0x700000+0xe14, 0);
	nva_wr32(cnum, 0x700000+0xe18, 0);
	nva_wr32(cnum, 0x700000+0xe1c, 0);
	nva_wr32(cnum, 0x700000+0xe20, 0);
	nva_wr32(cnum, 0x700000+0xe24, 0);
	nva_wr32(cnum, 0x700000+0xe28, 0);
	nva_wr32(cnum, 0x700000+0xe2c, 0);
	nva_wr32(cnum, 0x700000+0xe30, 0);
	nva_wr32(cnum, 0x700000+0xe34, 0);
	nva_wr32(cnum, 0x700000+0xe38, 0);
	nva_wr32(cnum, 0x700000+0xe3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xe40, 0);
	nva_wr32(cnum, 0x700000+0xe44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xe48, 0x10);
	nva_wr32(cnum, 0x700000+0xe4c, 0);
	nva_wr32(cnum, 0x700000+0xe50, 0x110000);
	nva_wr32(cnum, 0x700000+0xe54, 0x80000);
	nva_wr32(cnum, 0x700000+0xe58, 0);
	nva_wr32(cnum, 0x700000+0xe5c, 0);
	nva_wr32(cnum, 0x700000+0xe60, 0);
	nva_wr32(cnum, 0x700000+0xe64, 0);
	nva_wr32(cnum, 0x700000+0xe68, 0);
	nva_wr32(cnum, 0x700000+0xe6c, 0);
	nva_wr32(cnum, 0x700000+0xe70, 0);
	nva_wr32(cnum, 0x700000+0xe74, 0);
	nva_wr32(cnum, 0x700000+0xe78, 0);
	nva_wr32(cnum, 0x700000+0xe7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xe80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xe84, 0);
	nva_wr32(cnum, 0x700000+0xe88, 0x410);
	nva_wr32(cnum, 0x700000+0xe8c, 0);
	nva_wr32(cnum, 0x700000+0xe90, 0);
	nva_wr32(cnum, 0x700000+0xe94, 0);
	nva_wr32(cnum, 0x700000+0xe98, 0x101);
	for (i = 0; i <= 0x1000; i+= 4)
		nva_wr32(cnum, 0x700000+0x6000 + i, 0);
	nva_wr32(cnum, 0x700000+0x7008, 0x1);
	if (base == 0x103000)
		nva_wr32(cnum, 0x700000+0x700c, 0x00600004);
	else
		nva_wr32(cnum, 0x700000+0x700c, 0x00400004);
	nva_wr32(cnum, 0x700000+0x1100, 0x0019003d);
	nva_wr32(cnum, 0x700000+0x1104, 0xffffffff);
	nva_wr32(cnum, 0x700000+0x1108, 0);
	nva_wr32(cnum, 0x700000+0x110c, 0);
	nva_wr32(cnum, 0x700000+0x1110, 0);
	nva_wr32(cnum, 0x700000+0x1114, 0);
	nva_wr32(cnum, 0x700000+0x9000, 1);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0x2600, 0x8000100d);
	nva_wr32(cnum, 0x2604, 0xc000100f);
	nva_wr32(cnum, 0x27fc, 0x8000100e);
	nva_wr32(cnum, 0x32f4, 0x109);
	nva_wr32(cnum, 0x32ec, 0x1);
	nva_wr32(cnum, 0x2500, 0x101);
	nva_wr32(cnum, 0x700000+0x20000, 0x00040000);
	nva_wr32(cnum, 0x700000+0x20004, 0x00000001);
	nva_wr32(cnum, 0x700000+0x10000, 0x00120000);
	nva_wr32(cnum, 0x700000+0x10004, 0x00008000);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0xc0208c, 1);
	return 0;
}